

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

int js_std_init(JSContext *ctx,JSModuleDef *m)

{
  JSValue obj;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSValue JVar1;
  JSContext *unaff_retaddr;
  JSValue proto;
  JSClassID in_stack_ffffffffffffff6c;
  JSContext *in_stack_ffffffffffffff70;
  JSClassDef *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar2;
  JSClassID in_stack_ffffffffffffff84;
  undefined4 uVar3;
  JSContext *in_stack_ffffffffffffff88;
  JSContext *ctx_00;
  BOOL in_stack_ffffffffffffff90;
  BOOL is_popen;
  BOOL in_stack_ffffffffffffff94;
  BOOL close_in_finalizer;
  FILE *in_stack_ffffffffffffff98;
  JSContext *f;
  JSContext *in_stack_ffffffffffffffa0;
  int iStack_24;
  
  JS_NewClassID(&js_std_file_class_id);
  JS_GetRuntime(in_RDI);
  JS_NewClass((JSRuntime *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
              in_stack_ffffffffffffff78);
  JVar1 = JS_NewObject((JSContext *)0x10d1c2);
  iStack_24 = JVar1.tag._4_4_;
  obj.tag._0_4_ = in_stack_ffffffffffffff90;
  obj.u.ptr = in_stack_ffffffffffffff88;
  obj.tag._4_4_ = in_stack_ffffffffffffff94;
  JS_SetPropertyFunctionList
            ((JSContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),obj,
             (JSCFunctionListEntry *)in_stack_ffffffffffffff78,
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  JVar1.tag._0_4_ = in_stack_ffffffffffffff80;
  JVar1.u.ptr = in_stack_ffffffffffffff78;
  JVar1.tag._4_4_ = in_stack_ffffffffffffff84;
  JS_SetClassProto(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,JVar1);
  JS_SetModuleExportList
            (unaff_retaddr,(JSModuleDef *)in_RDI,(JSCFunctionListEntry *)in_RSI,iStack_24);
  ctx_00 = in_RSI;
  js_new_std_file(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                  in_stack_ffffffffffffff90);
  val.u._4_4_ = in_stack_ffffffffffffff94;
  val.u.int32 = in_stack_ffffffffffffff90;
  val.tag = (int64_t)in_stack_ffffffffffffff98;
  JS_SetModuleExport(in_stack_ffffffffffffff88,
                     (JSModuleDef *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (char *)in_RSI,val);
  uVar2 = SUB84(in_RDI,0);
  uVar3 = (undefined4)((ulong)in_RDI >> 0x20);
  f = ctx_00;
  js_new_std_file(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                  in_stack_ffffffffffffff90);
  val_00.u._4_4_ = in_stack_ffffffffffffff94;
  val_00.u.int32 = in_stack_ffffffffffffff90;
  val_00.tag = (int64_t)in_stack_ffffffffffffff98;
  JS_SetModuleExport(ctx_00,(JSModuleDef *)CONCAT44(uVar3,uVar2),(char *)in_RSI,val_00);
  is_popen = (BOOL)in_RDI;
  close_in_finalizer = (BOOL)((ulong)in_RDI >> 0x20);
  js_new_std_file(in_stack_ffffffffffffffa0,(FILE *)f,close_in_finalizer,is_popen);
  val_01.u._4_4_ = close_in_finalizer;
  val_01.u.int32 = is_popen;
  val_01.tag = (int64_t)f;
  JS_SetModuleExport(ctx_00,(JSModuleDef *)CONCAT44(uVar3,uVar2),(char *)in_RSI,val_01);
  return 0;
}

Assistant:

static int js_std_init(JSContext *ctx, JSModuleDef *m)
{
    JSValue proto;
    
    /* FILE class */
    /* the class ID is created once */
    JS_NewClassID(&js_std_file_class_id);
    /* the class is created once per runtime */
    JS_NewClass(JS_GetRuntime(ctx), js_std_file_class_id, &js_std_file_class);
    proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, proto, js_std_file_proto_funcs,
                               countof(js_std_file_proto_funcs));
    JS_SetClassProto(ctx, js_std_file_class_id, proto);

    JS_SetModuleExportList(ctx, m, js_std_funcs,
                           countof(js_std_funcs));
    JS_SetModuleExport(ctx, m, "in", js_new_std_file(ctx, stdin, FALSE, FALSE));
    JS_SetModuleExport(ctx, m, "out", js_new_std_file(ctx, stdout, FALSE, FALSE));
    JS_SetModuleExport(ctx, m, "err", js_new_std_file(ctx, stderr, FALSE, FALSE));
    return 0;
}